

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void read_message_from_console(void)

{
  size_t sVar1;
  _Rb_tree_node_base *p_Var2;
  undefined1 *apuStack_186e8 [2];
  undefined1 auStack_186d8 [16];
  char message [100000];
  
  fgets(message,100000,_stdin);
  apuStack_186e8[0] = auStack_186d8;
  sVar1 = strlen(message);
  std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_186e8,message,message + sVar1);
  std::__cxx11::string::operator=((string *)&tosend_message_abi_cxx11_,(string *)apuStack_186e8);
  if (apuStack_186e8[0] != auStack_186d8) {
    operator_delete(apuStack_186e8[0]);
  }
  fprintf(_stderr,"Input from console: %s\n",message);
  if (flag_root == false) {
    create_new_message(1,id_parent);
  }
  p_Var2 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)children._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &children._M_t._M_impl.super__Rb_tree_header) {
    do {
      create_new_message(1,p_Var2[1]._M_color);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &children._M_t._M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void read_message_from_console() {
    char message[MESSAGE_MAX_SIZE];
    fgets(message, MESSAGE_MAX_SIZE, stdin);
    tosend_message = std::string(message);
    fprintf(stderr, "Input from console: %s\n", message);

    if (!flag_root) {
        create_new_message(MSG, id_parent);
    }
    for (auto ch : children) {
        create_new_message(MSG, ch);
    }
}